

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O2

void duckdb::AggregateExecutor::
     UnaryFlatLoop<duckdb::ModeState<unsigned_long,duckdb::ModeStandard<unsigned_long>>,unsigned_long,duckdb::ModeFunction<duckdb::ModeStandard<unsigned_long>>>
               (unsigned_long *idata,AggregateInputData *aggr_input_data,
               ModeState<unsigned_long,_duckdb::ModeStandard<unsigned_long>_> **states,
               ValidityMask *mask,idx_t count)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  idx_t iVar5;
  unsigned_long *puVar6;
  ulong uVar7;
  ulong uVar8;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    for (iVar5 = 0; count != iVar5; iVar5 = iVar5 + 1) {
      BaseModeFunction<duckdb::ModeStandard<unsigned_long>>::
      Execute<unsigned_long,duckdb::ModeState<unsigned_long,duckdb::ModeStandard<unsigned_long>>,duckdb::ModeFunction<duckdb::ModeStandard<unsigned_long>>>
                (states[iVar5],idata,aggr_input_data);
      idata = idata + 1;
    }
  }
  else {
    uVar4 = 0;
    for (uVar3 = 0; uVar3 != count + 0x3f >> 6; uVar3 = uVar3 + 1) {
      puVar6 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar6 == (unsigned_long *)0x0) {
        uVar7 = uVar4 + 0x40;
        if (count <= uVar4 + 0x40) {
          uVar7 = count;
        }
LAB_01d3e2d0:
        puVar6 = idata + uVar4;
        for (; uVar2 = uVar4, uVar4 < uVar7; uVar4 = uVar4 + 1) {
          BaseModeFunction<duckdb::ModeStandard<unsigned_long>>::
          Execute<unsigned_long,duckdb::ModeState<unsigned_long,duckdb::ModeStandard<unsigned_long>>,duckdb::ModeFunction<duckdb::ModeStandard<unsigned_long>>>
                    (states[uVar4],puVar6,aggr_input_data);
          puVar6 = puVar6 + 1;
        }
      }
      else {
        uVar1 = puVar6[uVar3];
        uVar7 = uVar4 + 0x40;
        if (count <= uVar4 + 0x40) {
          uVar7 = count;
        }
        if (uVar1 == 0xffffffffffffffff) goto LAB_01d3e2d0;
        uVar2 = uVar7;
        if (uVar1 != 0) {
          puVar6 = idata + uVar4;
          for (uVar8 = 0; uVar2 = uVar4 + uVar8, uVar4 + uVar8 < uVar7; uVar8 = uVar8 + 1) {
            if ((uVar1 >> (uVar8 & 0x3f) & 1) != 0) {
              BaseModeFunction<duckdb::ModeStandard<unsigned_long>>::
              Execute<unsigned_long,duckdb::ModeState<unsigned_long,duckdb::ModeStandard<unsigned_long>>,duckdb::ModeFunction<duckdb::ModeStandard<unsigned_long>>>
                        (states[uVar4 + uVar8],puVar6,aggr_input_data);
            }
            puVar6 = puVar6 + 1;
          }
        }
      }
      uVar4 = uVar2;
    }
  }
  return;
}

Assistant:

static inline void UnaryFlatLoop(const INPUT_TYPE *__restrict idata, AggregateInputData &aggr_input_data,
	                                 STATE_TYPE **__restrict states, ValidityMask &mask, idx_t count) {
		if (OP::IgnoreNull() && !mask.AllValid()) {
			AggregateUnaryInput input(aggr_input_data, mask);
			auto &base_idx = input.input_idx;
			base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[base_idx], idata[base_idx], input);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[base_idx], idata[base_idx],
							                                                   input);
						}
					}
				}
			}
		} else {
			AggregateUnaryInput input(aggr_input_data, mask);
			auto &i = input.input_idx;
			for (i = 0; i < count; i++) {
				OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[i], idata[i], input);
			}
		}
	}